

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readmtm.c
# Opt level: O0

DUMB_IT_SIGDATA * it_mtm_load_sigdata(DUMBFILE *f,int *version)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int32 iVar7;
  DUMB_IT_SIGDATA *__ptr;
  IT_SAMPLE *pIVar8;
  uchar *puVar9;
  IT_PATTERN *pIVar10;
  unsigned_short *sequence_00;
  size_t sVar11;
  uchar *puVar12;
  int *in_RSI;
  DUMBFILE *in_RDI;
  int p;
  int m;
  size_t l;
  int sep;
  char *comment;
  unsigned_short *sequence;
  uchar *track;
  int n_channels;
  int n_rows;
  int l_comment;
  int n_tracks;
  int o;
  int n;
  DUMB_IT_SIGDATA *sigdata;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  DUMBFILE *in_stack_ffffffffffffffa0;
  long lVar13;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  void *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  int local_28;
  int local_24;
  
  iVar2 = dumbfile_getc((DUMBFILE *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  if (iVar2 != 0x4d) {
    return (DUMB_IT_SIGDATA *)0x0;
  }
  iVar2 = dumbfile_getc((DUMBFILE *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  if (iVar2 != 0x54) {
    return (DUMB_IT_SIGDATA *)0x0;
  }
  iVar2 = dumbfile_getc((DUMBFILE *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  if (iVar2 != 0x4d) {
    return (DUMB_IT_SIGDATA *)0x0;
  }
  iVar2 = dumbfile_getc((DUMBFILE *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  *in_RSI = iVar2;
  __ptr = (DUMB_IT_SIGDATA *)malloc(0x138);
  if (__ptr == (DUMB_IT_SIGDATA *)0x0) {
    return (DUMB_IT_SIGDATA *)0x0;
  }
  dumbfile_getnc(in_stack_ffffffffffffffb8,(int32)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                 (DUMBFILE *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  __ptr->name[0x14] = '\0';
  iVar2 = dumbfile_igetw((DUMBFILE *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  iVar3 = dumbfile_getc((DUMBFILE *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  __ptr->n_patterns = iVar3 + 1;
  iVar3 = dumbfile_getc((DUMBFILE *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  __ptr->n_orders = iVar3 + 1;
  iVar3 = dumbfile_igetw((DUMBFILE *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  iVar4 = dumbfile_getc((DUMBFILE *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  __ptr->n_samples = iVar4;
  dumbfile_getc((DUMBFILE *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  iVar4 = dumbfile_getc((DUMBFILE *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  iVar5 = dumbfile_getc((DUMBFILE *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  iVar6 = dumbfile_error(in_RDI);
  if (((((iVar6 != 0) || (iVar2 < 1)) || (__ptr->n_samples < 1)) || ((iVar4 < 1 || (0x40 < iVar4))))
     || ((iVar5 < 1 || (0x20 < iVar5)))) {
LAB_009a6d8d:
    free(__ptr);
    return (DUMB_IT_SIGDATA *)0x0;
  }
  memset(__ptr->channel_volume,0x40,0x40);
  iVar7 = dumbfile_getnc(in_stack_ffffffffffffffb8,(int32)((ulong)in_stack_ffffffffffffffb0 >> 0x20)
                         ,(DUMBFILE *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8))
  ;
  if (iVar7 < 0x20) goto LAB_009a6d8d;
  for (local_24 = 0; local_24 < 0x20; local_24 = local_24 + 1) {
    if (__ptr->channel_pan[local_24] < 0x10) {
      __ptr->channel_pan[local_24] =
           __ptr->channel_pan[local_24] - (char)((int)(__ptr->channel_pan[local_24] & 8) >> 3);
      __ptr->channel_pan[local_24] =
           (uchar)((ulong)(long)(int)((uint)__ptr->channel_pan[local_24] << 5) / 7);
    }
    else {
      __ptr->channel_volume[local_24] = '\0';
      __ptr->channel_pan[local_24] = '\a';
    }
  }
  for (local_24 = 0x20; local_24 < 0x40; local_24 = local_24 + 4) {
    in_stack_ffffffffffffffac = (dumb_it_default_panning_separation << 5) / 100;
    cVar1 = (char)in_stack_ffffffffffffffac;
    __ptr->channel_pan[local_24] = ' ' - cVar1;
    __ptr->channel_pan[local_24 + 1] = cVar1 + ' ';
    __ptr->channel_pan[local_24 + 2] = cVar1 + ' ';
    __ptr->channel_pan[local_24 + 3] = ' ' - cVar1;
  }
  pIVar8 = (IT_SAMPLE *)malloc((long)__ptr->n_samples * 0x68);
  __ptr->sample = pIVar8;
  if (__ptr->sample == (IT_SAMPLE *)0x0) goto LAB_009a6d8d;
  __ptr->flags = 0xf1;
  __ptr->global_volume = 0x80;
  __ptr->mixing_volume = 0x30;
  __ptr->speed = 6;
  __ptr->tempo = 0x7d;
  __ptr->pan_separation = 0x80;
  __ptr->song_message = (uchar *)0x0;
  __ptr->order = (uchar *)0x0;
  __ptr->instrument = (IT_INSTRUMENT *)0x0;
  __ptr->pattern = (IT_PATTERN *)0x0;
  __ptr->midi = (IT_MIDI *)0x0;
  __ptr->checkpoint = (IT_CHECKPOINT *)0x0;
  __ptr->n_instruments = 0;
  __ptr->restart_position = '\0';
  __ptr->n_pchannels = iVar5;
  for (local_24 = 0; local_24 < __ptr->n_samples; local_24 = local_24 + 1) {
    __ptr->sample[local_24].data = (void *)0x0;
  }
  for (local_24 = 0; local_24 < __ptr->n_samples; local_24 = local_24 + 1) {
    iVar6 = it_mtm_read_sample_header
                      ((IT_SAMPLE *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                       in_stack_ffffffffffffffa0);
    if (iVar6 != 0) goto LAB_009a6d78;
  }
  puVar9 = (uchar *)malloc((long)__ptr->n_orders);
  __ptr->order = puVar9;
  if ((((__ptr->order == (uchar *)0x0) ||
       (iVar7 = dumbfile_getnc(in_stack_ffffffffffffffb8,
                               (int32)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                               (DUMBFILE *)
                               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)),
       iVar7 < __ptr->n_orders)) ||
      ((__ptr->n_orders < 0x80 &&
       (iVar6 = dumbfile_skip((DUMBFILE *)
                              CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                              (long)in_stack_ffffffffffffffa0), iVar6 != 0)))) ||
     (puVar9 = (uchar *)malloc((long)(iVar2 * 0xc0)), puVar9 == (uchar *)0x0)) goto LAB_009a6d78;
  iVar7 = dumbfile_getnc(in_stack_ffffffffffffffb8,(int32)((ulong)in_stack_ffffffffffffffb0 >> 0x20)
                         ,(DUMBFILE *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8))
  ;
  if (SBORROW4(iVar7,iVar2 * 0xc0) == iVar7 + iVar2 * -0xc0 < 0) {
    pIVar10 = (IT_PATTERN *)malloc((long)__ptr->n_patterns << 4);
    __ptr->pattern = pIVar10;
    if (__ptr->pattern != (IT_PATTERN *)0x0) {
      for (local_24 = 0; local_24 < __ptr->n_patterns; local_24 = local_24 + 1) {
        __ptr->pattern[local_24].entry = (IT_ENTRY *)0x0;
      }
      sequence_00 = (unsigned_short *)malloc((long)(__ptr->n_patterns << 5) << 1);
      if (sequence_00 != (unsigned_short *)0x0) {
        for (local_24 = 0; local_24 < __ptr->n_patterns; local_24 = local_24 + 1) {
          for (local_28 = 0; local_28 < 0x20; local_28 = local_28 + 1) {
            iVar6 = dumbfile_igetw((DUMBFILE *)
                                   CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
            sequence_00[local_24 * 0x20 + local_28] = (unsigned_short)iVar6;
            if (iVar2 < (int)(uint)sequence_00[local_24 * 0x20 + local_28]) {
              sequence_00[local_24 * 0x20 + local_28] = 0;
            }
          }
        }
        for (local_24 = 0; local_24 < __ptr->n_patterns; local_24 = local_24 + 1) {
          iVar2 = it_mtm_assemble_pattern
                            ((IT_PATTERN *)CONCAT44(iVar4,iVar5),puVar9,sequence_00,
                             (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
          if (iVar2 != 0) goto LAB_009a6d64;
        }
        if (iVar3 == 0) {
LAB_009a6ce2:
          local_24 = 0;
          while( true ) {
            if (__ptr->n_samples <= local_24) {
              _dumb_it_fix_invalid_orders
                        ((DUMB_IT_SIGDATA *)
                         CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
              free(sequence_00);
              free(puVar9);
              return __ptr;
            }
            iVar2 = it_mtm_read_sample_data
                              ((IT_SAMPLE *)
                               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                               in_stack_ffffffffffffffa0);
            if (iVar2 != 0) break;
            local_24 = local_24 + 1;
          }
        }
        else {
          in_stack_ffffffffffffffb0 = malloc((long)iVar3);
          if (in_stack_ffffffffffffffb0 != (void *)0x0) {
            iVar7 = dumbfile_getnc((char *)sequence_00,
                                   (int32)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                                   (DUMBFILE *)
                                   CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
            if (iVar3 <= iVar7) {
              local_28 = -1;
              for (local_24 = 0; local_24 < iVar3; local_24 = local_24 + 0x28) {
                if (*(char *)((long)in_stack_ffffffffffffffb0 + (long)local_24) != '\0') {
                  local_28 = local_24;
                }
              }
              if (-1 < local_28) {
                lVar13 = 0;
                for (local_24 = 0; local_24 <= local_28; local_24 = local_24 + 0x28) {
                  sVar11 = strlen_max((char *)((long)in_stack_ffffffffffffffb0 + (long)local_24),
                                      0x28);
                  lVar13 = sVar11 + 2 + lVar13;
                }
                in_stack_ffffffffffffffa0 = (DUMBFILE *)(lVar13 - 1);
                puVar12 = (uchar *)malloc((size_t)in_stack_ffffffffffffffa0);
                __ptr->song_message = puVar12;
                if (__ptr->song_message == (uchar *)0x0) goto LAB_009a6d5a;
                iVar2 = 0;
                for (local_24 = 0; local_24 <= local_28; local_24 = local_24 + 0x28) {
                  sVar11 = strlen_max((char *)((long)in_stack_ffffffffffffffb0 + (long)local_24),
                                      0x28);
                  iVar3 = (int)sVar11;
                  if (iVar3 != 0) {
                    memcpy(__ptr->song_message + iVar2,
                           (void *)((long)in_stack_ffffffffffffffb0 + (long)local_24),(long)iVar3);
                    iVar2 = iVar3 + iVar2;
                  }
                  if (1 < (ulong)((long)in_stack_ffffffffffffffa0 - (long)iVar2)) {
                    iVar3 = iVar2 + 1;
                    __ptr->song_message[iVar2] = '\r';
                    iVar2 = iVar2 + 2;
                    __ptr->song_message[iVar3] = '\n';
                  }
                }
                __ptr->song_message[iVar2] = '\0';
              }
              free(in_stack_ffffffffffffffb0);
              goto LAB_009a6ce2;
            }
LAB_009a6d5a:
            free(in_stack_ffffffffffffffb0);
          }
        }
LAB_009a6d64:
        free(sequence_00);
      }
    }
  }
  free(puVar9);
LAB_009a6d78:
  _dumb_it_unload_sigdata(in_stack_ffffffffffffffb0);
  return (DUMB_IT_SIGDATA *)0x0;
}

Assistant:

static DUMB_IT_SIGDATA *it_mtm_load_sigdata(DUMBFILE *f, int * version)
{
	DUMB_IT_SIGDATA *sigdata;

	int n, o, n_tracks, l_comment, n_rows, n_channels;

	unsigned char * track;

	unsigned short * sequence;

	char * comment;

	if (dumbfile_getc(f) != 'M' ||
		dumbfile_getc(f) != 'T' ||
		dumbfile_getc(f) != 'M') goto error;

	*version = dumbfile_getc(f);

	sigdata = malloc(sizeof(*sigdata));
	if (!sigdata) goto error;

    dumbfile_getnc((char *)sigdata->name, 20, f);
	sigdata->name[20] = 0;

	n_tracks = dumbfile_igetw(f);
	sigdata->n_patterns = dumbfile_getc(f) + 1;
	sigdata->n_orders = dumbfile_getc(f) + 1;
	l_comment = dumbfile_igetw(f);
	sigdata->n_samples = dumbfile_getc(f);
	//if (dumbfile_getc(f)) goto error_sd;
	dumbfile_getc(f);
	n_rows = dumbfile_getc(f);
	n_channels = dumbfile_getc(f);

	if (dumbfile_error(f) ||
		(n_tracks <= 0) ||
		(sigdata->n_samples <= 0) ||
		(n_rows <= 0 || n_rows > 64) ||
		(n_channels <= 0 || n_channels > 32)) goto error_sd;

	memset(sigdata->channel_volume, 64, DUMB_IT_N_CHANNELS);

    if (dumbfile_getnc((char *)sigdata->channel_pan, 32, f) < 32) goto error_sd;

	for (n = 0; n < 32; n++) {
		if (sigdata->channel_pan[n] <= 15) {
			sigdata->channel_pan[n] -= (sigdata->channel_pan[n] & 8) >> 3;
			sigdata->channel_pan[n] = (sigdata->channel_pan[n] * 32) / 7;
		} else {
			sigdata->channel_volume[n] = 0;
			sigdata->channel_pan[n] = 7;
		}
	}

	for (n = 32; n < DUMB_IT_N_CHANNELS; n += 4) {
		int sep = 32 * dumb_it_default_panning_separation / 100;
		sigdata->channel_pan[n  ] = 32 - sep;
		sigdata->channel_pan[n+1] = 32 + sep;
		sigdata->channel_pan[n+2] = 32 + sep;
		sigdata->channel_pan[n+3] = 32 - sep;
	}

	sigdata->sample = malloc(sigdata->n_samples * sizeof(*sigdata->sample));
	if (!sigdata->sample) goto error_sd;

	sigdata->flags = IT_WAS_AN_XM | IT_WAS_A_MOD | IT_STEREO | IT_OLD_EFFECTS | IT_COMPATIBLE_GXX;

	sigdata->global_volume = 128;
	sigdata->mixing_volume = 48;
	sigdata->speed = 6;
	sigdata->tempo = 125;
	sigdata->pan_separation = 128;

	sigdata->song_message = NULL;
	sigdata->order = NULL;
	sigdata->instrument = NULL;
	sigdata->pattern = NULL;
	sigdata->midi = NULL;
	sigdata->checkpoint = NULL;

	sigdata->n_instruments = 0;

	sigdata->restart_position = 0;
	sigdata->n_pchannels = n_channels;

	for (n = 0; n < sigdata->n_samples; n++)
		sigdata->sample[n].data = NULL;

	for (n = 0; n < sigdata->n_samples; n++) {
		if (it_mtm_read_sample_header(&sigdata->sample[n], f)) goto error_usd;
	}

	sigdata->order = malloc(sigdata->n_orders);
	if (!sigdata->order) goto error_usd;

    if (dumbfile_getnc((char *)sigdata->order, sigdata->n_orders, f) < sigdata->n_orders) goto error_usd;
	if (sigdata->n_orders < 128)
		if (dumbfile_skip(f, 128 - sigdata->n_orders)) goto error_usd;

	track = malloc(192 * n_tracks);
	if (!track) goto error_usd;

    if (dumbfile_getnc((char *)track, 192 * n_tracks, f) < 192 * n_tracks) goto error_ft;

	sigdata->pattern = malloc(sigdata->n_patterns * sizeof(*sigdata->pattern));
	if (!sigdata->pattern) goto error_ft;
	for (n = 0; n < sigdata->n_patterns; n++)
		sigdata->pattern[n].entry = NULL;

	sequence = malloc(sigdata->n_patterns * 32 * sizeof(*sequence));
	if (!sequence) goto error_ft;

	for (n = 0; n < sigdata->n_patterns; n++) {
		for (o = 0; o < 32; o++) {
			sequence[(n * 32) + o] = dumbfile_igetw(f);
			if (sequence[(n * 32) + o] > n_tracks)
			{
				//goto error_fs;
				// illegal track number, silence instead of rejecting the file
				sequence[(n * 32) + o] = 0;
			}
		}
	}

	for (n = 0; n < sigdata->n_patterns; n++) {
		if (it_mtm_assemble_pattern(&sigdata->pattern[n], track, &sequence[n * 32], n_rows)) goto error_fs;
	}

	if (l_comment) {
		comment = malloc(l_comment);
		if (!comment) goto error_fs;
		if (dumbfile_getnc(comment, l_comment, f) < l_comment) goto error_fc;

		/* Time for annoying "logic", yes. We want each line which has text,
		 * and each blank line in between all the valid lines.
		 */

		/* Find last actual line. */
		for (o = -1, n = 0; n < l_comment; n += 40) {
			if (comment[n]) o = n;
		}

		if (o >= 0) {

			size_t l;
			int m;
			for (l = 0, n = 0; n <= o; n += 40) {
				l += strlen_max(&comment[n], 40) + 2;
			}

			l -= 1;

			sigdata->song_message = malloc(l);
			if (!sigdata->song_message) goto error_fc;

			for (m = 0, n = 0; n <= o; n += 40) {
				int p = (int)strlen_max(&comment[n], 40);
				if (p) {
					memcpy(sigdata->song_message + m, &comment[n], p);
					m += p;
				}
				if (l - m > 1) {
					sigdata->song_message[m++] = 13;
					sigdata->song_message[m++] = 10;
				}
			}
			
			sigdata->song_message[m] = 0;
		}

		free(comment);
	}

	for (n = 0; n < sigdata->n_samples; n++) {
		if (it_mtm_read_sample_data(&sigdata->sample[n], f)) goto error_fs;
	}

	_dumb_it_fix_invalid_orders(sigdata);

	free(sequence);
	free(track);

	return sigdata;

error_fc:
	free(comment);
error_fs:
	free(sequence);
error_ft:
	free(track);
error_usd:
	_dumb_it_unload_sigdata(sigdata);
	return NULL;

error_sd:
	free(sigdata);
error:
	return NULL;
}